

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> * __thiscall
sfc::Palette::subpalettes_matching
          (vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
           *__return_storage_ptr__,Palette *this,Image *image)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  runtime_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  reference local_1c0;
  reference local_1b8;
  Subpalette *sp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *__range1;
  uint local_190;
  uint local_18c;
  v10 *local_188;
  char *local_180;
  string local_178;
  uint *local_158;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_150;
  undefined1 local_148 [8];
  rgba_set_t cs;
  rgba_vec_t local_108;
  undefined1 local_f0 [8];
  rgba_vec_t rc;
  Image *image_local;
  Palette *this_local;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> *sv;
  undefined1 local_98 [16];
  v10 *local_88;
  char *local_80;
  uint *local_78;
  v10 *local_70;
  v10 *local_68;
  char *pcStack_60;
  string *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> **local_38;
  undefined1 *local_30;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> **local_10;
  
  rc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._7_1_ = 0;
  std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>::vector
            (__return_storage_ptr__);
  Image::rgba_data(&local_108,image);
  reduce_colors((rgba_vec_t *)local_f0,&local_108,this->_mode);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_108);
  local_150._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0);
  local_158 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)local_148,
             local_150,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_158);
  sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_148);
  if (this->_max_colors_per_subpalette < sVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_188 = (v10 *)0x1d5242;
    local_180 = (char *)0x3a;
    local_18c = Image::src_coord_x(image);
    local_190 = Image::src_coord_y(image);
    local_58 = &local_178;
    local_68 = local_188;
    pcStack_60 = local_180;
    local_70 = (v10 *)&local_18c;
    local_78 = &local_190;
    local_50 = &local_68;
    local_88 = local_188;
    local_80 = local_180;
    local_48 = local_88;
    pcStack_40 = local_80;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
                *)&sv,local_70,local_78,(uint *)local_188);
    local_30 = local_98;
    local_38 = &sv;
    local_20 = 0x22;
    fmt.size_ = 0x22;
    fmt.data_ = local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_178,local_88,fmt,args);
    std::runtime_error::runtime_error(this_00,(string *)&local_178);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __end1 = std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::begin
                     (&this->_subpalettes);
  sp = (Subpalette *)
       std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::end(&this->_subpalettes);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                      (&__end1,(__normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                                *)&sp);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1b8 = __gnu_cxx::
                __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                ::operator*(&__end1);
    uVar2 = Subpalette::diff(local_1b8,(rgba_set_t *)local_148);
    if (uVar2 == 0) {
      local_1c0 = local_1b8;
      std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>::push_back
                (__return_storage_ptr__,&local_1c0);
    }
    __gnu_cxx::
    __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
    ::operator++(&__end1);
  }
  rc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._7_1_ = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_148)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0);
  if ((rc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Subpalette*> Palette::subpalettes_matching(const Image& image) const {
  std::vector<const Subpalette*> sv;

  auto rc = reduce_colors(image.rgba_data(), _mode);
  rgba_set_t cs(rc.begin(), rc.end());

  if (cs.size() > _max_colors_per_subpalette) {
    throw std::runtime_error(
      fmt::format("Tile with too many unique colors at {},{} in source image\n", image.src_coord_x(), image.src_coord_y()));
  }

  for (const Subpalette& sp : _subpalettes) {
    if (sp.diff(cs) == 0)
      sv.push_back(&sp);
  }

  return sv;
}